

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool TestHashList<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  double dVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> revhashes;
  HashSet<unsigned_int> collisions;
  
  bVar1 = true;
  if ((int)CONCAT71(in_register_00000011,testCollision) != 0) {
    dVar5 = EstimateNbCollisions
                      ((int)((ulong)((long)(hashes->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(hashes->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 2),0x20);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",0x20);
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_left =
         &collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ._M_t._M_impl.super__Rb_tree_header._M_header;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_node_count = 0;
    collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>._M_t.
    _M_impl.super__Rb_tree_header._M_header._M_right =
         collisions.super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>.
         _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar3 = FindCollisions<unsigned_int>(hashes,&collisions,1000);
    printf("actual %6i (%.2fx)",(ulong)uVar3);
    bVar1 = (double)(int)uVar3 / dVar5 <= 2.0;
    if (!bVar1) {
      printf(" !!!!!");
    }
    putchar(10);
    fflush((FILE *)0x0);
    if (testHighBits) {
      bVar1 = TestHighbitsCollisions<unsigned_int>(hashes);
      bVar1 = (double)(int)uVar3 / dVar5 <= 2.0 && bVar1;
    }
    if (testLowBits) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&revhashes,hashes);
      for (uVar4 = 0;
          uVar4 < (ulong)((long)revhashes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)revhashes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
        uVar3 = bitreverse<unsigned_int>
                          ((hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start[uVar4],0x20);
        revhashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = uVar3;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      bVar2 = TestLowbitsCollisions<unsigned_int>(&revhashes);
      bVar1 = (bool)(bVar1 & bVar2);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&revhashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&collisions);
  }
  if (testDist) {
    bVar2 = TestDistribution<unsigned_int>(hashes,drawDiagram);
    bVar1 = bVar1 != false && bVar2;
  }
  return bVar1;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if (testCollision)
  {
    size_t const count = hashes.size();
    double const expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if ((collcount / expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");
    fflush(NULL);

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 224);
      result &= CountHighbitsCollisions(hashes, 160);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);

      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountHighbitsCollisions(hashes,   12);
      //result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(hashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 224);
      result &= CountLowbitsCollisions(revhashes, 160);
      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountLowbitsCollisions(revhashes,   12);
      //result &= CountLowbitsCollisions(revhashes,   8);

      //std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}